

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O0

void __thiscall
breakpoint_recorder::replace_pending(breakpoint_recorder *this,string *name,var *function)

{
  bool bVar1;
  size_t sVar2;
  callable *this_00;
  function *this_01;
  pointer prVar3;
  reference pbVar4;
  key_arg<std::__cxx11::basic_string<char>_> *in_RDI;
  breakpoint *it;
  iterator __end3;
  iterator __begin3;
  forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
  *__range3;
  iterator key;
  function_type *target;
  any *in_stack_ffffffffffffff98;
  variant<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
  *this_02;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
  *in_stack_ffffffffffffffb0;
  _Self in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  
  sVar2 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                      *)in_stack_ffffffffffffffc0._M_node,
                     (key_arg<std::__cxx11::basic_string<char>_> *)in_stack_ffffffffffffffb8._M_node
                    );
  if (sVar2 != 0) {
    this_00 = cs_impl::any::const_val<cs::callable>((any *)__end3._M_node);
    cs::callable::get_raw_data(this_00);
    this_01 = std::
              function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
              target<cs::function>
                        ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                          *)in_stack_ffffffffffffffb8._M_node);
    cs::function::set_debugger_state(this_01,true);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,bool>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
    ::find<std::__cxx11::string>(in_stack_ffffffffffffffb0,in_RDI);
    prVar3 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
             ::iterator::operator->((iterator *)0x133a2a);
    if (((prVar3->second).second & 1U) != 0) {
      std::
      forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
      ::begin((forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
               *)in_stack_ffffffffffffff98);
      std::
      forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
      ::end((forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
             *)in_stack_ffffffffffffff98);
      while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc0,
                                     (_Self *)&stack0xffffffffffffffb8), bVar1) {
        pbVar4 = std::_Fwd_list_iterator<breakpoint_recorder::breakpoint>::operator*
                           ((_Fwd_list_iterator<breakpoint_recorder::breakpoint> *)0x133a7b);
        this_02 = (variant<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
                   *)pbVar4->id;
        prVar3 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                 ::iterator::operator->((iterator *)0x133a97);
        if (this_02 ==
            (variant<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
             *)(prVar3->second).first) {
          variant_impl::variant<unsigned_long,std::__cxx11::string,cs_impl::any>::
          emplace<cs_impl::any,cs_impl::any_const&>(this_02,in_stack_ffffffffffffff98);
          prVar3 = phmap::priv::
                   raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                   ::iterator::operator->((iterator *)0x133ac2);
          (prVar3->second).second = false;
          return;
        }
        std::_Fwd_list_iterator<breakpoint_recorder::breakpoint>::operator++
                  ((_Fwd_list_iterator<breakpoint_recorder::breakpoint> *)&stack0xffffffffffffffc0);
      }
    }
  }
  return;
}

Assistant:

void replace_pending(const std::string &name, const cs::var &function)
	{
		if (m_pending.count(name) > 0) {
			const cs::callable::function_type &target = function.const_val<cs::callable>().get_raw_data();
			target.target<cs::function>()->set_debugger_state(true);
			auto key = m_pending.find(name);
			if (key->second.second) {
				for (auto &it: m_breakpoints) {
					if (it.id == key->second.first) {
						it.data.emplace<cs::var>(function);
						key->second.second = false;
						break;
					}
				}
			}
		}
	}